

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall
eastl::vector<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>::DoInsertValue
          (vector<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator> *this,
          iterator position,value_type *value)

{
  basic_string<char,_eastl::allocator> **ppbVar1;
  value_type *pvVar2;
  value_type *pvVar3;
  basic_string<char,_eastl::allocator> *pbVar4;
  int iVar5;
  value_type *pvVar6;
  uint uVar7;
  basic_string<char,_eastl::allocator> *pbVar8;
  basic_string<char,_eastl::allocator> *pbVar9;
  generic_iterator<eastl::basic_string<char,_eastl::allocator>_*,_void> currentDest;
  basic_string<char,_eastl::allocator> *pbVar10;
  value_type *pvVar11;
  iterator pbVar12;
  
  pvVar2 = (this->super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>).
           mpEnd;
  if (pvVar2 == (this->
                super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>).
                mpCapacity) {
    pbVar12 = (this->super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>
              ).mpBegin;
    iVar5 = (int)((ulong)((long)pvVar2 - (long)pbVar12) >> 5);
    uVar7 = 1;
    if (iVar5 != 0) {
      uVar7 = iVar5 * 2;
    }
    if (uVar7 == 0) {
      pbVar8 = (basic_string<char,_eastl::allocator> *)0x0;
      pbVar9 = pbVar8;
    }
    else {
      pbVar8 = (basic_string<char,_eastl::allocator> *)malloc((ulong)uVar7 << 5);
      pbVar9 = pbVar8;
    }
    for (; pbVar12 != position; pbVar12 = pbVar12 + 1) {
      pbVar8->mpBegin = (value_type *)0x0;
      pbVar8->mpEnd = (value_type *)0x0;
      pbVar8->mpCapacity = (value_type *)0x0;
      pbVar8->mpBegin = pbVar12->mpBegin;
      pbVar12->mpBegin = (value_type *)0x0;
      pvVar3 = pbVar8->mpEnd;
      pbVar8->mpEnd = pbVar12->mpEnd;
      pbVar12->mpEnd = pvVar3;
      pvVar3 = pbVar8->mpCapacity;
      pbVar8->mpCapacity = pbVar12->mpCapacity;
      pbVar12->mpCapacity = pvVar3;
      pbVar8 = pbVar8 + 1;
    }
    pbVar8->mpBegin = (value_type *)0x0;
    pbVar8->mpEnd = (value_type *)0x0;
    pbVar8->mpCapacity = (value_type *)0x0;
    pbVar8->mpBegin = value->mpBegin;
    value->mpBegin = (value_type *)0x0;
    pvVar3 = pbVar8->mpEnd;
    pbVar8->mpEnd = value->mpEnd;
    value->mpEnd = pvVar3;
    pvVar3 = pbVar8->mpCapacity;
    pbVar8->mpCapacity = value->mpCapacity;
    value->mpCapacity = pvVar3;
    pbVar12 = (this->super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>
              ).mpEnd;
    pbVar8 = pbVar8 + 1;
    if (pbVar12 != position) {
      do {
        pbVar8->mpBegin = (value_type *)0x0;
        pbVar8->mpEnd = (value_type *)0x0;
        pbVar8->mpCapacity = (value_type *)0x0;
        pbVar8->mpBegin = position->mpBegin;
        position->mpBegin = (value_type *)0x0;
        pvVar3 = pbVar8->mpEnd;
        pbVar8->mpEnd = position->mpEnd;
        position->mpEnd = pvVar3;
        pvVar3 = pbVar8->mpCapacity;
        pbVar8->mpCapacity = position->mpCapacity;
        position->mpCapacity = pvVar3;
        position = position + 1;
        pbVar8 = pbVar8 + 1;
      } while (position != pbVar12);
    }
    pbVar4 = (this->super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>)
             .mpEnd;
    for (pbVar10 = (this->
                   super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>).
                   mpBegin; pbVar10 < pbVar4; pbVar10 = pbVar10 + 1) {
      pvVar3 = pbVar10->mpBegin;
      if ((pvVar3 != (value_type *)0x0) && (1 < (long)pbVar10->mpCapacity - (long)pvVar3)) {
        operator_delete__(pvVar3);
      }
    }
    pbVar10 = (this->super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>
              ).mpBegin;
    if (pbVar10 != (basic_string<char,_eastl::allocator> *)0x0) {
      operator_delete__(pbVar10);
    }
    (this->super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>).mpBegin
         = pbVar9;
    (this->super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>).mpEnd =
         pbVar8;
    (this->super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>).
    mpCapacity = pbVar9 + uVar7;
  }
  else {
    pvVar11 = value + (value < pvVar2 && position <= value);
    pvVar2->mpBegin = (value_type *)0x0;
    pvVar2->mpEnd = (value_type *)0x0;
    pvVar6 = pvVar2[-1].mpEnd;
    pvVar3 = pvVar2->mpEnd;
    pvVar2->mpBegin = pvVar2[-1].mpBegin;
    pvVar2->mpEnd = pvVar6;
    pvVar2[-1].mpBegin = (value_type *)0x0;
    pvVar2[-1].mpEnd = pvVar3;
    pvVar2->mpCapacity = pvVar2[-1].mpCapacity;
    pvVar2[-1].mpCapacity = (value_type *)0x0;
    pbVar8 = (this->super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>)
             .mpEnd;
    while (pbVar9 = pbVar8 + -1, pbVar9 != position) {
      basic_string<char,_eastl::allocator>::assign(pbVar9,pbVar8[-2].mpBegin,pbVar8[-2].mpEnd);
      pbVar8 = pbVar9;
    }
    if (pvVar11 != position) {
      basic_string<char,_eastl::allocator>::assign(position,pvVar11->mpBegin,pvVar11->mpEnd);
    }
    ppbVar1 = &(this->
               super_VectorBase<eastl::basic_string<char,_eastl::allocator>,_eastl::allocator>).
               mpEnd;
    *ppbVar1 = *ppbVar1 + 1;
  }
  return;
}

Assistant:

void vector<T, Allocator>::DoInsertValue(iterator position, value_type&& value)
    {
#if EASTL_ASSERT_ENABLED
            if(EASTL_UNLIKELY((position < mpBegin) || (position > mpEnd)))
                EASTL_FAIL_MSG("vector::insert -- invalid position");
#endif

        if(mpEnd != mpCapacity) // If size < capacity ...
        {
            // EASTL_ASSERT(position < mpEnd); // We don't call this function unless position is less than end, and the code directly below relies on this.
            // We need to take into account the possibility that value may come from within the vector itself.
            const T* pValue = &value;
            if((pValue >= position) && (pValue < mpEnd)) // If value comes from within the range to be moved...
                ++pValue;
            ::new(mpEnd) value_type(std::forward<T>(*(mpEnd - 1)));
            eastl::copy_backward(position, mpEnd - 1, mpEnd); // We need copy_backward because of potential overlap issues.
            *position = *pValue;
            ++mpEnd;
        }
        else // else (size == capacity)
        {
            const size_type nPrevSize = size_type(mpEnd - mpBegin);
            const size_type nNewSize  = GetNewCapacity(nPrevSize);
            pointer const   pNewData  = DoAllocate(nNewSize);

#if EASTL_EXCEPTIONS_ENABLED
                pointer pNewEnd = pNewData;
                try
                {
                    pNewEnd = eastl::uninitialized_copy_ptr(mpBegin, position, pNewData);
                    ::new(pNewEnd) value_type(value);
                    pNewEnd = eastl::uninitialized_copy_ptr(position, mpEnd, ++pNewEnd);
                }
                catch(...)
                {
                    DoDestroyValues(pNewData, pNewEnd);
                    DoFree(pNewData, nNewSize);
                    throw;
                }
#else
                pointer pNewEnd = eastl::uninitialized_copy_ptr(mpBegin, position, pNewData);
                ::new(pNewEnd) value_type(std::forward<T>(value));
                pNewEnd = eastl::uninitialized_copy_ptr(position, mpEnd, ++pNewEnd);
#endif

            DoDestroyValues(mpBegin, mpEnd);
            DoFree(mpBegin, (size_type)(mpCapacity - mpBegin));

            mpBegin    = pNewData;
            mpEnd      = pNewEnd;
            mpCapacity = pNewData + nNewSize;
        }
    }